

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execShiftRg<(moira::Core)2,(moira::Instr)95,(moira::Mode)0,4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  
  this->cp = 0;
  uVar6 = *(uint *)((long)&(this->reg).field_3 + (ulong)(opcode >> 9 & 7) * 4);
  uVar1 = (this->reg).pc;
  (this->reg).pc0 = uVar1;
  (this->queue).ird = (this->queue).irc;
  uVar1 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar1 + 2);
  (this->queue).irc = (u16)uVar1;
  this->readBuffer = (u16)uVar1;
  uVar3 = (ulong)*(uint *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  uVar6 = uVar6 & 0x3f;
  uVar5 = uVar6;
  if (uVar6 == 0) {
    bVar4 = false;
  }
  else {
    do {
      uVar2 = uVar3;
      uVar3 = (ulong)(uint)((int)uVar2 << 0x1f) | uVar2 >> 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    bVar4 = (bool)((byte)uVar2 & 1);
  }
  (this->reg).sr.c = bVar4;
  (this->reg).sr.v = false;
  (this->reg).sr.n = SUB81(uVar3 >> 0x1f,0);
  (this->reg).sr.z = (int)uVar3 == 0;
  *(int *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = (int)uVar3;
  (*this->_vptr_Moira[2])(this,(ulong)(uVar6 + 8 + this->cp));
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    int cnt = readD(src) & 0x3F;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(  8 + cnt );
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES( 12 + cnt );
                break;
                
            default:
                
                CYCLES(  6 + cnt );
                break;
        }
    }

    FINALIZE
}